

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *rhs)

{
  undefined8 *puVar1;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  fpclass_type fVar7;
  int32_t iVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  undefined8 uVar10;
  Real eps;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  ulong uVar16;
  cpp_dec_float<50U,_int,_void> *this_00;
  ulong uVar17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  uVar4 = rhs->memused;
  *(undefined4 *)(this + 8) = 0;
  uVar17 = 0;
  uVar16 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar16 = uVar17;
  }
  for (; uVar16 * 0x3c != uVar17; uVar17 = uVar17 + 0x3c) {
    pNVar9 = rhs->m_elem;
    iVar5 = *(int *)((long)(&pNVar9->val + 1) + uVar17);
    uVar10 = *(undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + uVar17 + 0x20);
    puVar1 = (undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + uVar17);
    uVar11 = *puVar1;
    uVar12 = puVar1[1];
    puVar1 = (undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + uVar17 + 0x10);
    uVar13 = *puVar1;
    uVar14 = puVar1[1];
    iVar6 = *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + uVar17);
    bVar3 = *(bool *)((long)(&(pNVar9->val).m_backend.data + 1) + uVar17 + 4);
    fVar7 = *(fpclass_type *)((long)(&(pNVar9->val).m_backend.data + 1) + uVar17 + 8);
    iVar8 = *(int32_t *)((long)(&(pNVar9->val).m_backend.data + 1) + uVar17 + 0xc);
    puVar2 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + uVar17);
    local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
    local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
    puVar2 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + uVar17 + 0x10);
    local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_68.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + uVar17 + 0x20);
    local_68.m_backend.exp = iVar6;
    local_68.m_backend.neg = bVar3;
    local_68.m_backend.fpclass = fVar7;
    local_68.m_backend.prec_elem = iVar8;
    eps = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
    bVar15 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_68,eps);
    this_00 = (cpp_dec_float<50U,_int,_void> *)((long)iVar5 * 0x38 + *(long *)(this + 0x20));
    if (bVar15) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,0);
    }
    else {
      *(undefined8 *)((this_00->data)._M_elems + 8) = uVar10;
      *(undefined8 *)((this_00->data)._M_elems + 4) = uVar13;
      *(undefined8 *)((this_00->data)._M_elems + 6) = uVar14;
      *(undefined8 *)(this_00->data)._M_elems = uVar11;
      *(undefined8 *)((this_00->data)._M_elems + 2) = uVar12;
      this_00->exp = iVar6;
      this_00->neg = bVar3;
      this_00->fpclass = fVar7;
      this_00->prec_elem = iVar8;
      iVar6 = *(int *)(this + 8);
      *(int *)(this + 8) = iVar6 + 1;
      *(int *)(*(long *)(this + 0x10) + (long)iVar6 * 4) = iVar5;
    }
  }
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x1;
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign(const SVectorBase<S>& rhs)
{
   assert(rhs.dim() <= VectorBase<R>::dim());

   int s = rhs.size();
   num = 0;

   for(int i = 0; i < s; ++i)
   {
      int k = rhs.index(i);
      S v = rhs.value(i);

      if(isZero(v, this->tolerances()->epsilon()))
         VectorBase<R>::val[k] = 0;
      else
      {
         VectorBase<R>::val[k] = v;
         idx[num++] = k;
      }
   }

   setupStatus = true;

   assert(isConsistent());

   return *this;
}